

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_buffer.h
# Opt level: O0

void __thiscall draco::EncoderBuffer::BitEncoder::PutBit(BitEncoder *this,uint8_t value)

{
  byte bVar1;
  ulong uVar2;
  int bit_shift;
  uint64_t byte_offset;
  uint64_t off;
  int byte_size;
  uint8_t value_local;
  BitEncoder *this_local;
  
  uVar2 = this->bit_offset_ >> 3;
  bVar1 = (byte)this->bit_offset_ & 7;
  this->bit_buffer_[uVar2] = this->bit_buffer_[uVar2] & ((byte)(1 << bVar1) ^ 0xff);
  this->bit_buffer_[uVar2] = this->bit_buffer_[uVar2] | value << bVar1;
  this->bit_offset_ = this->bit_offset_ + 1;
  return;
}

Assistant:

void PutBit(uint8_t value) {
      const int byte_size = 8;
      const uint64_t off = static_cast<uint64_t>(bit_offset_);
      const uint64_t byte_offset = off / byte_size;
      const int bit_shift = off % byte_size;

      // TODO(fgalligan): Check performance if we add a branch and only do one
      // memory write if bit_shift is 7. Also try using a temporary variable to
      // hold the bits before writing to the buffer.

      bit_buffer_[byte_offset] &= ~(1 << bit_shift);
      bit_buffer_[byte_offset] |= value << bit_shift;
      bit_offset_++;
    }